

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pockle.c
# Opt level: O0

PockleStatus pockle_insert(Pockle *pockle,mp_int *p,mp_int **factors,size_t nfactors,mp_int *w)

{
  size_t sVar1;
  PocklePrimeRecord *e;
  mp_int *pmVar2;
  PocklePrimeRecord *pPVar3;
  PocklePrimeRecord **ppPVar4;
  ulong local_50;
  size_t i;
  PocklePrimeRecord *found;
  PocklePrimeRecord *pr;
  mp_int *w_local;
  size_t nfactors_local;
  mp_int **factors_local;
  mp_int *p_local;
  Pockle *pockle_local;
  
  e = (PocklePrimeRecord *)safemalloc(1,0x28,0);
  pmVar2 = mp_copy(p);
  e->prime = pmVar2;
  pPVar3 = (PocklePrimeRecord *)add234(pockle->tree,e);
  if (e == pPVar3) {
    if (w == (mp_int *)0x0) {
      e->factors = (PocklePrimeRecord **)0x0;
      e->nfactors = 0;
      e->witness = (mp_int *)0x0;
    }
    else {
      ppPVar4 = (PocklePrimeRecord **)safemalloc(nfactors,8,0);
      e->factors = ppPVar4;
      for (local_50 = 0; local_50 < nfactors; local_50 = local_50 + 1) {
        pPVar3 = (PocklePrimeRecord *)find234(pockle->tree,factors[local_50],ppr_find);
        e->factors[local_50] = pPVar3;
        if (e->factors[local_50] == (PocklePrimeRecord *)0x0) {
          __assert_fail("pr->factors[i]",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/pockle.c"
                        ,0x4c,
                        "PockleStatus pockle_insert(Pockle *, mp_int *, mp_int **, size_t, mp_int *)"
                       );
        }
      }
      e->nfactors = nfactors;
      pmVar2 = mp_copy(w);
      e->witness = pmVar2;
    }
    e->index = pockle->nlist;
    ppPVar4 = (PocklePrimeRecord **)
              safegrowarray(pockle->list,&pockle->listsize,8,pockle->nlist,1,false);
    pockle->list = ppPVar4;
    sVar1 = pockle->nlist;
    pockle->nlist = sVar1 + 1;
    pockle->list[sVar1] = e;
  }
  else {
    mp_free(e->prime);
    safefree(e);
  }
  return POCKLE_OK;
}

Assistant:

static PockleStatus pockle_insert(Pockle *pockle, mp_int *p, mp_int **factors,
                                  size_t nfactors, mp_int *w)
{
    PocklePrimeRecord *pr = snew(PocklePrimeRecord);
    pr->prime = mp_copy(p);

    PocklePrimeRecord *found = add234(pockle->tree, pr);
    if (pr != found) {
        /* it was already in there */
        mp_free(pr->prime);
        sfree(pr);
        return POCKLE_OK;
    }

    if (w) {
        pr->factors = snewn(nfactors, PocklePrimeRecord *);
        for (size_t i = 0; i < nfactors; i++) {
            pr->factors[i] = find234(pockle->tree, factors[i], ppr_find);
            assert(pr->factors[i]);
        }
        pr->nfactors = nfactors;
        pr->witness = mp_copy(w);
    } else {
        pr->factors = NULL;
        pr->nfactors = 0;
        pr->witness = NULL;
    }
    pr->index = pockle->nlist;

    sgrowarray(pockle->list, pockle->listsize, pockle->nlist);
    pockle->list[pockle->nlist++] = pr;
    return POCKLE_OK;
}